

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateConditional(ExpressionEvalContext *ctx,ExprConditional *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  int iVar5;
  ExprRationalLiteral *expr;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  _func_int **pp_Var7;
  char *msg;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 != 0) && ((ctx->stackFrames).data[uVar1 - 1]->targetYield != 0)) {
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar6->typeID = 2;
    pEVar6->source = pSVar3;
    pEVar6->type = pTVar4;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223698;
    return pEVar6;
  }
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    pEVar6 = Evaluate(ctx,expression->condition);
    if (pEVar6 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    switch(pEVar6->typeID) {
    case 3:
      pp_Var7 = (_func_int **)(ulong)(byte)pEVar6->field_0x29;
      break;
    case 4:
      pp_Var7 = (_func_int **)(long)(char)pEVar6->field_0x29;
      break;
    default:
      msg = "ERROR: failed to evaluate ternary operator condition";
      goto LAB_001385e1;
    case 6:
      pp_Var7 = pEVar6[1]._vptr_ExprBase;
      break;
    case 7:
      pp_Var7 = (_func_int **)(long)(double)pEVar6[1]._vptr_ExprBase;
    }
    pEVar6 = Evaluate(ctx,(&expression->trueBlock)[pp_Var7 == (_func_int **)0x0]);
    if (pEVar6 != (ExprBase *)0x0) {
      pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
      return pEVar6;
    }
  }
  else {
    msg = "ERROR: instruction limit reached";
LAB_001385e1:
    Report(ctx,msg);
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateConditional(ExpressionEvalContext &ctx, ExprConditional *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *condition = Evaluate(ctx, expression->condition);

	if(!condition)
		return NULL;

	long long result;
	if(!TryTakeLong(condition, result))
		return Report(ctx, "ERROR: failed to evaluate ternary operator condition");

	ExprBase *value = Evaluate(ctx, result ? expression->trueBlock : expression->falseBlock);

	if(!value)
		return NULL;

	return CheckType(expression, value);
}